

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

void __thiscall slang::ast::EvalContext::reset(EvalContext *this)

{
  SmallVectorBase<slang::Diagnostic> *in_RDI;
  size_type local_18;
  size_type local_10;
  
  in_RDI->firstElement[0x24] = '\0';
  in_RDI->firstElement[0x25] = '\0';
  in_RDI->firstElement[0x26] = '\0';
  in_RDI->firstElement[0x27] = '\0';
  in_RDI->firstElement[0x28] = '\0';
  in_RDI->firstElement[0x29] = '\0';
  in_RDI->firstElement[0x2a] = '\0';
  in_RDI->firstElement[0x2b] = '\0';
  in_RDI->firstElement[0x2c] = '\0';
  in_RDI->firstElement[0x2d] = '\0';
  in_RDI->firstElement[0x2e] = '\0';
  in_RDI->firstElement[0x2f] = '\0';
  in_RDI->firstElement[0x30] = '\0';
  in_RDI->firstElement[0x31] = '\0';
  in_RDI->firstElement[0x32] = '\0';
  in_RDI->firstElement[0x33] = '\0';
  in_RDI->firstElement[0x34] = '\0';
  in_RDI->firstElement[0x35] = '\0';
  in_RDI->firstElement[0x36] = '\0';
  in_RDI->firstElement[0x37] = '\0';
  SmallVectorBase<slang::ast::EvalContext::Frame>::clear
            ((SmallVectorBase<slang::ast::EvalContext::Frame> *)in_RDI);
  SmallVectorBase<slang::ast::LValue_*>::clear((SmallVectorBase<slang::ast::LValue_*> *)in_RDI);
  SmallVectorBase<slang::Diagnostic>::clear(in_RDI);
  SmallVectorBase<slang::Diagnostic>::clear(in_RDI);
  SourceRange::SourceRange((SourceRange *)in_RDI);
  in_RDI[6].len = local_18;
  in_RDI[6].cap = local_10;
  in_RDI[6].firstElement[0] = '\0';
  return;
}

Assistant:

void EvalContext::reset() {
    steps = 0;
    disableTarget = nullptr;
    queueTarget = nullptr;
    stack.clear();
    lvalStack.clear();
    diags.clear();
    warnings.clear();
    disableRange = {};
    backtraceReported = false;
}